

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitStructNew(WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  uint uVar1;
  Struct *pSVar2;
  Expression *pEVar3;
  StructNew *pSVar4;
  size_type __new_size;
  Builder local_68;
  Expression **local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  HeapType local_38;
  HeapType heapType;
  
  if (code - 7 < 2) {
    local_60 = out;
    local_38 = getIndexedHeapType(this);
    operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (code == 7) {
      pSVar2 = HeapType::getStruct(&local_38);
      __new_size = (long)(pSVar2->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pSVar2->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_start >> 4;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::resize
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58,
                 __new_size);
      for (uVar1 = 0; uVar1 < __new_size; uVar1 = uVar1 + 1) {
        pEVar3 = popNonVoidExpression(this);
        *(Expression **)((long)auStack_58 + (__new_size + ~(ulong)uVar1) * 8) = pEVar3;
      }
    }
    local_68.wasm = this->wasm;
    pSVar4 = Builder::
             makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (&local_68,local_38,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_58);
    *local_60 = (Expression *)pSVar4;
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58);
  }
  return code - 7 < 2;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitStructNew(Expression*& out, uint32_t code) {
  if (code == BinaryConsts::StructNew ||
      code == BinaryConsts::StructNewDefault) {
    auto heapType = getIndexedHeapType();
    std::vector<Expression*> operands;
    if (code == BinaryConsts::StructNew) {
      auto numOperands = heapType.getStruct().fields.size();
      operands.resize(numOperands);
      for (Index i = 0; i < numOperands; i++) {
        operands[numOperands - i - 1] = popNonVoidExpression();
      }
    }
    out = Builder(wasm).makeStructNew(heapType, operands);
    return true;
  }
  return false;
}